

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O1

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>::ChContactNSC
          (ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_> *this,
          ChContactContainer *mcontainer,ChContactable_1vars<3> *mobjA,ChContactable_1vars<3> *mobjB
          ,ChCollisionInfo *cinfo,ChMaterialCompositeNSC *mat)

{
  undefined1 auVar1 [32];
  
  ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>::ChContactTuple
            (&this->
              super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>,
             mcontainer,mobjA,mobjB,cinfo);
  (this->super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
  _vptr_ChContactTuple = (_func_int **)&PTR__ChContactNSC_00b3a3f0;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.valid = false;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.disabled = false;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.redundant = false;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.broken = false;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.active = true;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.g_i = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_a.variables = (ChVariables *)0x0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.variables = (ChVariables *)0x0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.variables = (ChVariables *)0x0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Nx).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b3a550;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.mode = CONSTRAINT_FRIC;
  (this->Nx).super_ChConstraintTwoTuplesContactNall.friction = (double)SUB168(auVar1._0_16_,0);
  (this->Nx).super_ChConstraintTwoTuplesContactNall.cohesion = (double)SUB168(auVar1._0_16_,8);
  (this->Nx).constraint_U =
       (ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
        *)auVar1._16_8_;
  (this->Nx).constraint_V =
       (ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
        *)auVar1._24_8_;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraint_00b629f0;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.valid = false;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.disabled = false;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.redundant = false;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.broken = false;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.active = true;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.g_i = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_a.variables = (ChVariables *)0x0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.variables = (ChVariables *)0x0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.variables = (ChVariables *)0x0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Tu).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b3a6e0;
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.mode = CONSTRAINT_FRIC;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraint_00b629f0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.valid = false;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.disabled = false;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.redundant = false;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.broken = false;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.active = true;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.g_i = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_a.variables = (ChVariables *)0x0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.variables = (ChVariables *)0x0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_a.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.variables = (ChVariables *)0x0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 8) = 0.0;
  *(double *)
   ((long)&(this->Tv).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
           .tuple_b.Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
   + 0x10) = 0.0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b3a6e0;
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.mode = CONSTRAINT_FRIC;
  *(undefined1 (*) [16])(this->react_force).m_data = ZEXT416(0) << 0x40;
  (this->react_force).m_data[2] = 0.0;
  (this->Nx).constraint_U = &this->Tu;
  (this->Nx).constraint_V = &this->Tv;
  Reset(this,mobjA,mobjB,cinfo,mat);
  return;
}

Assistant:

ChContactNSC(ChContactContainer* mcontainer,           ///< contact container
                 Ta* mobjA,                                ///< collidable object A
                 Tb* mobjB,                                ///< collidable object B
                 const collision::ChCollisionInfo& cinfo,  ///< data for the collision pair
                 const ChMaterialCompositeNSC&  mat        ///< composite material
                 )
        : ChContactTuple<Ta, Tb>(mcontainer, mobjA, mobjB, cinfo) {
        Nx.SetTangentialConstraintU(&Tu);
        Nx.SetTangentialConstraintV(&Tv);

        Reset(mobjA, mobjB, cinfo, mat);
    }